

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_ags.cpp
# Opt level: O3

WMMAAccessChain dxil_spv::build_wmma_access_chain(Impl *impl,Value *offset,Value *stride)

{
  Id IVar1;
  Id IVar2;
  Builder *this;
  Operation *pOVar3;
  mapped_type *meta;
  Operation *this_00;
  LoggingCallback p_Var4;
  void *pvVar5;
  ulong uVar6;
  uint32_t uVar7;
  WMMAAccessChain WVar8;
  char buffer [4096];
  Capability local_1038;
  char acStack_1034 [4];
  char acStack_1030 [4];
  char acStack_102c [4];
  undefined5 uStack_1028;
  undefined3 uStack_1023;
  undefined3 uStack_1020;
  undefined2 local_101d;
  undefined3 uStack_101b;
  undefined3 uStack_1018;
  char acStack_1015 [4069];
  
  this = Converter::Impl::builder(impl);
  if ((impl->ags).active_uav_op == AtomicBinOp) {
    IVar1 = spv::Builder::makeIntegerType(this,0x20,false);
    IVar1 = spv::Builder::makePointer(this,StorageClassWorkgroup,IVar1);
    pOVar3 = Converter::Impl::allocate(impl,OpAccessChain,IVar1);
    Operation::add_id(pOVar3,(impl->ags).active_uav_ptr);
    IVar1 = Converter::Impl::get_id_for_value(impl,offset,0);
    Operation::add_id(pOVar3,IVar1);
    Converter::Impl::add(impl,pOVar3,false);
    IVar1 = pOVar3->id;
LAB_0017c683:
    uVar7 = 0;
    IVar2 = Converter::Impl::get_id_for_value(impl,stride,0);
    uVar6 = (ulong)IVar2;
  }
  else {
    meta = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&impl->handle_to_resource_meta,&(impl->ags).active_uav_ptr);
    if ((meta->storage == StorageClassStorageBuffer) || ((impl->ags).active_uav_op == AtomicBinOp))
    {
      IVar1 = get_buffer_alias_handle(impl,meta,(impl->ags).active_uav_ptr,Integer,B8,V1);
      if (IVar1 != 0) {
        IVar2 = spv::Builder::makeIntegerType(this,8,false);
        IVar2 = spv::Builder::makePointer(this,StorageClassStorageBuffer,IVar2);
        pOVar3 = Converter::Impl::allocate(impl,OpAccessChain,IVar2);
        Operation::add_id(pOVar3,IVar1);
        IVar1 = spv::Builder::makeIntegerType(this,0x20,false);
        IVar1 = spv::Builder::makeIntConstant(this,IVar1,0,false);
        Operation::add_id(pOVar3,IVar1);
        IVar1 = Converter::Impl::get_id_for_value(impl,offset,0);
        Operation::add_id(pOVar3,IVar1);
        Converter::Impl::add(impl,pOVar3,false);
        IVar1 = pOVar3->id;
        goto LAB_0017c683;
      }
      p_Var4 = get_thread_log_callback();
      if (p_Var4 != (LoggingCallback)0x0) {
        uStack_1028 = 0x2072656666;
        uStack_1023 = 0x696c61;
        uStack_1020 = 0x2e7361;
        local_101d = 10;
        local_1038._0_1_ = 'F';
        local_1038._1_1_ = 'a';
        local_1038._2_1_ = 'i';
        local_1038._3_1_ = 'l';
        acStack_1034[0] = 'e';
        acStack_1034[1] = 'd';
        acStack_1034[2] = ' ';
        acStack_1034[3] = 't';
        acStack_1030[0] = 'o';
        acStack_1030[1] = ' ';
        acStack_1030[2] = 'g';
        acStack_1030[3] = 'e';
        acStack_102c[0] = 't';
        acStack_102c[1] = ' ';
        acStack_102c[2] = 'b';
        acStack_102c[3] = 'u';
        goto LAB_0017c6ea;
      }
      build_wmma_access_chain();
    }
    else {
      if (meta->storage == StorageClassPhysicalStorageBuffer) {
        IVar1 = (impl->ags).u8_array_bda_type;
        if (IVar1 == 0) {
          IVar1 = spv::Builder::makeIntegerType(this,8,false);
          IVar1 = spv::Builder::makeRuntimeArray(this,IVar1);
          (impl->ags).u8_array_bda_type = IVar1;
          spv::Builder::addDecoration(this,IVar1,DecorationArrayStride,1);
          IVar1 = (impl->ags).u8_array_bda_type;
        }
        IVar1 = spv::Builder::makePointer(this,StorageClassPhysicalStorageBuffer,IVar1);
        pOVar3 = Converter::Impl::allocate(impl,OpBitcast,IVar1);
        Operation::add_id(pOVar3,(impl->ags).active_uav_ptr);
        Converter::Impl::add(impl,pOVar3,false);
        IVar1 = spv::Builder::makeIntegerType(this,8,false);
        IVar1 = spv::Builder::makePointer(this,StorageClassPhysicalStorageBuffer,IVar1);
        this_00 = Converter::Impl::allocate(impl,OpAccessChain,IVar1);
        Operation::add_id(this_00,pOVar3->id);
        IVar1 = Converter::Impl::get_id_for_value(impl,offset,0);
        Operation::add_id(this_00,IVar1);
        Converter::Impl::add(impl,this_00,false);
        IVar1 = this_00->id;
        IVar2 = Converter::Impl::get_id_for_value(impl,stride,0);
        uVar6 = (ulong)IVar2;
        local_1038 = CapabilityInt8;
        std::
        _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
        ::_M_insert_unique<spv::Capability_const&>
                  ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                    *)&this->capabilities,&local_1038);
        uVar7 = 0x10;
        goto LAB_0017c707;
      }
      p_Var4 = get_thread_log_callback();
      if (p_Var4 == (LoggingCallback)0x0) {
        build_wmma_access_chain();
      }
      else {
        uStack_1018 = 0x2d6461;
        builtin_strncpy(acStack_1015,"store.\n",8);
        uStack_1028 = 0x204f425353;
        uStack_1023 = 0x726f66;
        uStack_1020 = 0x4d5720;
        local_101d = 0x414d;
        uStack_101b = 0x6f6c20;
        local_1038._0_1_ = 'E';
        local_1038._1_1_ = 'x';
        local_1038._2_1_ = 'p';
        local_1038._3_1_ = 'e';
        acStack_1034[0] = 'c';
        acStack_1034[1] = 't';
        acStack_1034[2] = 'e';
        acStack_1034[3] = 'd';
        acStack_1030[0] = ' ';
        acStack_1030[1] = 'B';
        acStack_1030[2] = 'D';
        acStack_1030[3] = 'A';
        acStack_102c[0] = ' ';
        acStack_102c[1] = 'o';
        acStack_102c[2] = 'r';
        acStack_102c[3] = ' ';
LAB_0017c6ea:
        pvVar5 = get_thread_log_callback_userdata();
        (*p_Var4)(pvVar5,Error,(char *)&local_1038);
      }
    }
    uVar7 = 0;
    uVar6 = 0;
    IVar1 = 0;
  }
LAB_0017c707:
  WVar8._0_8_ = (ulong)IVar1 | uVar6 << 0x20;
  WVar8.alignment = uVar7;
  return WVar8;
}

Assistant:

static WMMAAccessChain build_wmma_access_chain(
	Converter::Impl &impl, const llvm::Value *offset, const llvm::Value *stride)
{
	WMMAAccessChain ret = {};
	auto &builder = impl.builder();

	if (impl.ags.active_uav_op == DXIL::Op::AtomicBinOp)
	{
		// LDS access chains are in terms of u32 elements for whatever reason ...
		// This is convenient for us however, since SPIR-V is defined the same way.
		// TODO: Unsure what happens if the LDS pointer is u16, but FSR4 doesn't use that, so whatever.
		auto *chain = impl.allocate(spv::OpAccessChain,
		                            builder.makePointer(spv::StorageClassWorkgroup, builder.makeUintType(32)));
		chain->add_id(impl.ags.active_uav_ptr);
		chain->add_id(impl.get_id_for_value(offset));

		impl.add(chain);
		ret.chain_id = chain->id;
		ret.stride_id = impl.get_id_for_value(stride);
		return ret;
	}

	// Build the actual load.
	const auto &meta = impl.handle_to_resource_meta[impl.ags.active_uav_ptr];

	if (meta.storage == spv::StorageClassStorageBuffer || impl.ags.active_uav_op == DXIL::Op::AtomicBinOp)
	{
		spv::Id buffer_id = get_buffer_alias_handle(
			impl, meta, impl.ags.active_uav_ptr, RawType::Integer, RawWidth::B8, RawVecSize::V1);

		if (!buffer_id)
		{
			LOGE("Failed to get buffer alias.\n");
			return ret;
		}

		// Cooperative matrix is in terms of elements of the value type, not bytes.
		// We could use 8-bit storage, but that means adding a lot of extra cruft ...
		auto *chain = impl.allocate(spv::OpAccessChain,
		                            builder.makePointer(spv::StorageClassStorageBuffer, builder.makeUintType(8)));
		chain->add_id(buffer_id);
		chain->add_id(builder.makeUintConstant(0));
		chain->add_id(impl.get_id_for_value(offset));

		impl.add(chain);
		ret.chain_id = chain->id;
		ret.stride_id = impl.get_id_for_value(stride);
	}
	else if (meta.storage == spv::StorageClassPhysicalStorageBuffer)
	{
		if (!impl.ags.u8_array_bda_type)
		{
			impl.ags.u8_array_bda_type = builder.makeRuntimeArray(builder.makeUintType(8));
			builder.addDecoration(impl.ags.u8_array_bda_type, spv::DecorationArrayStride, 1);
		}

		auto *cast = impl.allocate(spv::OpBitcast,
		                           builder.makePointer(spv::StorageClassPhysicalStorageBuffer, impl.ags.u8_array_bda_type));

		cast->add_id(impl.ags.active_uav_ptr);
		impl.add(cast);

		auto *chain = impl.allocate(spv::OpAccessChain,
		                            builder.makePointer(spv::StorageClassPhysicalStorageBuffer, builder.makeUintType(8)));
		chain->add_id(cast->id);
		chain->add_id(impl.get_id_for_value(offset));
		impl.add(chain);

		ret.chain_id = chain->id;
		ret.stride_id = impl.get_id_for_value(stride);
		ret.alignment = 16; // Unsure what requirements are here. Just do the simple thing.

		builder.addCapability(spv::CapabilityInt8);
	}
	else
	{
		LOGE("Expected BDA or SSBO for WMMA load-store.\n");
	}

	return ret;
}